

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O2

bool mkvmuxer::WriteEbmlDateElement(IMkvWriter *writer,uint64 type,int64 value)

{
  int32 iVar1;
  
  if (writer == (IMkvWriter *)0x0) {
    return false;
  }
  iVar1 = WriteID(writer,type);
  if ((iVar1 == 0) && (iVar1 = WriteUInt(writer,8), iVar1 == 0)) {
    iVar1 = SerializeInt(writer,value,8);
    return iVar1 == 0;
  }
  return false;
}

Assistant:

bool WriteEbmlDateElement(IMkvWriter* writer, uint64 type, int64 value) {
  if (!writer)
    return false;

  if (WriteID(writer, type))
    return false;

  if (WriteUInt(writer, kDateElementSize))
    return false;

  if (SerializeInt(writer, value, kDateElementSize))
    return false;

  return true;
}